

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::
erase(Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> *this,
     Bucket bucket)

{
  Span *pSVar1;
  ulong uVar2;
  ulong uVar3;
  Span *pSVar4;
  Span *pSVar5;
  Span *fromSpan;
  size_t fromIndex;
  size_t to;
  Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> *this_00;
  
  Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::erase
            (bucket.span,bucket.index);
  this->size = this->size - 1;
  to = bucket.index;
  this_00 = bucket.span;
LAB_00130937:
  pSVar1 = this->spans;
  uVar2 = this->numBuckets >> 7;
  fromSpan = this_00;
  fromIndex = to;
  do {
    do {
      fromIndex = fromIndex + 1;
      if (fromIndex == 0x80) {
        fromSpan = fromSpan + 1;
        if (((long)fromSpan - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 - uVar2 == 0) {
          fromSpan = pSVar1;
        }
        fromIndex = 0;
      }
      if ((ulong)fromSpan->offsets[fromIndex] == 0xff) {
        return;
      }
      uVar3 = (long)*(int *)fromSpan->entries[fromSpan->offsets[fromIndex]].storage.data ^
              this->seed;
      uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
      uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
      uVar3 = (uVar3 >> 0x20 ^ uVar3) & this->numBuckets - 1;
      pSVar4 = pSVar1 + (uVar3 >> 7);
      uVar3 = (ulong)((uint)uVar3 & 0x7f);
    } while (uVar3 == fromIndex && pSVar4 == fromSpan);
    do {
      if ((pSVar4 == this_00) && (uVar3 == to)) {
        if (fromSpan == this_00) {
          this_00->offsets[to] = this_00->offsets[fromIndex];
          this_00->offsets[fromIndex] = 0xff;
          to = fromIndex;
          this_00 = fromSpan;
        }
        else {
          Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::
          moveFromSpan(this_00,fromSpan,fromIndex,to);
          to = fromIndex;
          this_00 = fromSpan;
        }
        goto LAB_00130937;
      }
      uVar3 = uVar3 + 1;
      if (uVar3 == 0x80) {
        pSVar5 = pSVar4 + 1;
        pSVar4 = pSVar1;
        if (((long)pSVar5 - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 - uVar2 != 0) {
          pSVar4 = pSVar5;
        }
        uVar3 = 0;
      }
    } while ((pSVar4 != fromSpan) || (uVar3 != fromIndex));
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }